

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.cpp
# Opt level: O1

int __thiscall QDateTime::offsetFromUtc(QDateTime *this)

{
  QDateTimePrivate *pQVar1;
  int iVar2;
  QFlagsStorage<QDateTimePrivate::TransitionOption> resolve;
  uint uVar3;
  long in_FS_OFFSET;
  ZoneState ZStack_28;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->d).d;
  if (((ulong)pQVar1 & 1) == 0) {
    uVar3 = (pQVar1->m_status).super_QFlagsStorageHelper<QDateTimePrivate::StatusFlag,_4>.
            super_QFlagsStorage<QDateTimePrivate::StatusFlag>.i;
  }
  else {
    uVar3 = (uint)pQVar1;
  }
  iVar2 = 0;
  if ((~uVar3 & 6) == 0) {
    if (((ulong)pQVar1 & 1) == 0) {
      iVar2 = pQVar1->m_offsetFromUtc;
    }
    else {
      iVar2 = 0;
      if ((uVar3 & 0x30) == 0) {
        resolve.i = 0x424;
        if (-1 < (char)uVar3) {
          resolve.i = 0x442;
        }
        QDateTimePrivate::localStateAtMillis
                  (&ZStack_28,(long)pQVar1 >> 8,(TransitionOptions)resolve.i);
        iVar2 = ZStack_28.offset;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return iVar2;
  }
  __stack_chk_fail();
}

Assistant:

int QDateTime::offsetFromUtc() const
{
    const auto status = getStatus(d);
    if (!status.testFlags(QDateTimePrivate::ValidDate | QDateTimePrivate::ValidTime))
        return 0;
    // But allow invalid date-time (e.g. gap's resolution) to report its offset.
    if (!d.isShort())
        return d->m_offsetFromUtc;

    auto spec = extractSpec(status);
    if (spec == Qt::LocalTime) {
        // We didn't cache the value, so we need to calculate it:
        const auto resolve = toTransitionOptions(extractDaylightStatus(status));
        return QDateTimePrivate::localStateAtMillis(getMSecs(d), resolve).offset;
    }

    Q_ASSERT(spec == Qt::UTC);
    return 0;
}